

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void test_read_at_least_no_buffer(void)

{
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  cio_error err;
  size_t read_buffer_size;
  client *client;
  
  ms = (memory_stream *)malloc(0x100);
  iVar1 = memory_stream_init(ms,test_read_at_least_no_buffer::test_data);
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x29d,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_init((cio_buffered_stream *)(ms + 1),(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x2a0,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_at_least
                    ((cio_buffered_stream *)(ms + 1),(cio_read_buffer *)0x0,0x28,dummy_read_handler,
                     (void *)0x0);
  UnityAssertEqualNumber
            (-0x16,(long)cVar2,"Return value not correct!",0x2a2,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x2a3,
             UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_close((cio_buffered_stream *)(ms + 1));
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x2a6,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x2a7,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_read_at_least_no_buffer(void)
{
	struct client *client = malloc(sizeof(*client));

	size_t read_buffer_size = 40;
	static const char *test_data = "Hello";
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");

	enum cio_error err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_read_at_least(&client->bs, NULL, read_buffer_size, dummy_read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, dummy_read_handler_fake.call_count, "Handler was not called!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
}